

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

dev_t archive_entry_rdevminor(archive_entry *entry)

{
  wchar_t wVar1;
  uint uVar2;
  archive_entry *entry_local;
  
  wVar1 = archive_entry_rdev_is_set(entry);
  if (wVar1 == L'\0') {
    entry_local = (archive_entry *)0x0;
  }
  else if ((entry->ae_stat).aest_rdev_is_broken_down == L'\0') {
    uVar2 = gnu_dev_minor((entry->ae_stat).aest_rdev);
    entry_local = (archive_entry *)(ulong)uVar2;
  }
  else {
    entry_local = (archive_entry *)(entry->ae_stat).aest_rdevminor;
  }
  return (dev_t)entry_local;
}

Assistant:

__LA_DEV_T
archive_entry_rdevminor(struct archive_entry *entry)
{
	if (archive_entry_rdev_is_set(entry)) {
		if (entry->ae_stat.aest_rdev_is_broken_down)
			return (entry->ae_stat.aest_rdevminor);
		else
			return minor(entry->ae_stat.aest_rdev);
	} else {
		return 0;
	}
}